

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O3

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  UniValue *pUVar1;
  bool bVar2;
  jtokentype jVar3;
  uint uVar4;
  jtokentype jVar5;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  char *raw;
  byte bVar6;
  bool bVar7;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  uint consumed;
  UniValue tmpVal;
  string tokenVal;
  UniValue *newTop;
  UniValue **local_118;
  iterator iStack_110;
  UniValue **local_108;
  ulong local_100;
  uint local_f4;
  vector<UniValue,_std::allocator<UniValue>_> *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string *local_e0;
  UniValue local_d8;
  char *local_80;
  string local_78;
  string local_58;
  char *local_38;
  
  raw = (char *)CONCAT44(in_register_00000034,__fd);
  clear(this);
  local_108 = (UniValue **)0x0;
  local_118 = (UniValue **)0x0;
  iStack_110._M_current = (UniValue **)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_80 = (char *)((long)__buf + (long)raw);
  local_e0 = (string *)&this->val;
  local_e8 = &this->keys;
  local_f0 = &this->values;
  bVar6 = 0;
  bVar2 = false;
  jVar5 = JTOK_NONE;
  do {
    local_38 = raw;
    jVar3 = getJsonToken(&local_78,&local_f4,raw,local_80);
    if ((uint)(jVar3 + JTOK_OBJ_OPEN) < 2) goto switchD_004fc047_default;
    local_100 = (ulong)local_f4;
    uVar4 = jVar3 + ~JTOK_COMMA;
    if ((bVar6 & 8) != 0) {
      if ((uVar4 < 5) || ((jVar3 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) {
        bVar6 = bVar6 & 0xf7;
        goto LAB_004fbff1;
      }
      goto switchD_004fc047_default;
    }
    if ((bVar6 & 4) != 0) {
      if (uVar4 < 5) {
        if ((bVar6 & 0x10) != 0) goto switchD_004fc047_default;
        bVar6 = bVar6 & 0xf3;
        goto LAB_004fc02c;
      }
      if (((uint)jVar3 < 5) && ((0x1aU >> (jVar3 & 0x1f) & 1) != 0)) {
        bVar6 = bVar6 & 0xf3;
      }
      unaff_RBP = 0;
      if (((uint)jVar3 < 5) && ((0x1aU >> (jVar3 & 0x1f) & 1) != 0)) goto LAB_004fbff1;
      goto LAB_004fc4d1;
    }
    if (bVar2) {
      if ((jVar3 == JTOK_OBJ_CLOSE) || (jVar3 == JTOK_STRING)) goto LAB_004fbff1;
      goto switchD_004fc047_default;
    }
    if ((bVar6 & 2) != 0) {
      if (jVar3 == JTOK_COLON) {
        bVar6 = bVar6 & 0xf0;
        bVar2 = false;
        goto LAB_004fbff1;
      }
      goto switchD_004fc047_default;
    }
    if (jVar3 == JTOK_COLON) goto switchD_004fc047_default;
LAB_004fbff1:
    if ((bVar6 & 0x10) != 0) {
      if ((uVar4 < 5) || ((jVar3 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) goto switchD_004fc047_default;
      bVar6 = bVar6 & 0xef;
    }
LAB_004fc02c:
    switch(jVar3) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      if (iStack_110._M_current == local_118) {
        if (jVar3 == JTOK_OBJ_OPEN) {
          setObject(this);
        }
        else {
          setArray(this);
        }
        local_d8._0_8_ = this;
        if (iStack_110._M_current == local_108) {
          std::vector<UniValue*,std::allocator<UniValue*>>::_M_realloc_insert<UniValue*>
                    ((vector<UniValue*,std::allocator<UniValue*>> *)&local_118,iStack_110,
                     (UniValue **)&local_d8);
        }
        else {
          *iStack_110._M_current = this;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        UniValue(&local_d8,(jVar3 != JTOK_OBJ_OPEN) + VOBJ,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        pUVar1 = iStack_110._M_current[-1];
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&pUVar1->values,&local_d8);
        local_58._M_dataplus._M_p =
             (pointer)((pUVar1->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1);
        if (iStack_110._M_current == local_108) {
          std::vector<UniValue*,std::allocator<UniValue*>>::_M_realloc_insert<UniValue*const&>
                    ((vector<UniValue*,std::allocator<UniValue*>> *)&local_118,iStack_110,
                     (UniValue **)&local_58);
        }
        else {
          *iStack_110._M_current = (UniValue *)local_58._M_dataplus._M_p;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        ~UniValue(&local_d8);
      }
      unaff_RBP = 0;
      bVar6 = bVar6 | (jVar3 != JTOK_OBJ_OPEN) * '\x03' + 1U;
      bVar2 = (bool)(bVar2 | jVar3 == JTOK_OBJ_OPEN);
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      unaff_RBP = 0;
      if ((jVar5 == JTOK_COMMA) || (iStack_110._M_current == local_118)) goto LAB_004fc4d1;
      if ((jVar3 != JTOK_OBJ_CLOSE) + VOBJ != iStack_110._M_current[-1]->typ)
      goto switchD_004fc047_default;
      iStack_110._M_current = iStack_110._M_current + -1;
      bVar6 = bVar6 & 0xee | 0x10;
      bVar2 = false;
LAB_004fc34c:
      unaff_RBP = 0;
      break;
    case JTOK_COLON:
      if ((iStack_110._M_current == local_118) || (iStack_110._M_current[-1]->typ != VOBJ))
      goto switchD_004fc047_default;
      bVar6 = bVar6 | 8;
      break;
    case JTOK_COMMA:
      if (iStack_110._M_current == local_118) goto switchD_004fc047_default;
      unaff_RBP = 0;
      if ((jVar5 != JTOK_ARR_OPEN) && (jVar5 != JTOK_COMMA)) {
        bVar7 = iStack_110._M_current[-1]->typ != VOBJ;
        bVar6 = bVar6 | bVar7 * '\x03' + 1U;
        bVar2 = (bool)(bVar2 | !bVar7);
        goto LAB_004fc34c;
      }
      goto LAB_004fc4d1;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      local_d8.val._M_dataplus._M_p = (pointer)&local_d8.val.field_2;
      local_d8.val._M_string_length = 0;
      local_d8.val.field_2._M_local_buf[0] = '\0';
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
      local_d8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (jVar3 == JTOK_KW_FALSE) {
        bVar7 = false;
LAB_004fc22a:
        setBool(&local_d8,bVar7);
      }
      else if (jVar3 == JTOK_KW_TRUE) {
        bVar7 = true;
        goto LAB_004fc22a;
      }
      if (iStack_110._M_current == local_118) {
        this->typ = local_d8.typ;
        std::__cxx11::string::_M_assign(local_e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(local_e8,&local_d8.keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_f0,&local_d8.values);
      }
      else {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_110._M_current[-1]->values,&local_d8);
LAB_004fc254:
        bVar6 = bVar6 | 0x10;
      }
      goto LAB_004fc481;
    case JTOK_NUMBER:
      UniValue(&local_d8,VNUM,&local_78);
      if (iStack_110._M_current != local_118) {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_110._M_current[-1]->values,&local_d8);
        goto LAB_004fc254;
      }
      this->typ = local_d8.typ;
      std::__cxx11::string::_M_assign(local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_e8,&local_d8.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_f0,&local_d8.values);
LAB_004fc481:
      ~UniValue(&local_d8);
      break;
    case JTOK_STRING:
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&iStack_110._M_current[-1]->keys,&local_78);
        bVar6 = bVar6 & 0xfc | 2;
        bVar2 = false;
      }
      else {
        UniValue(&local_d8,VSTR,&local_78);
        if (iStack_110._M_current == local_118) {
          this->typ = local_d8.typ;
          std::__cxx11::string::_M_assign(local_e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(local_e8,&local_d8.keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_f0,&local_d8.values);
          goto LAB_004fc481;
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_110._M_current[-1]->values,&local_d8);
        ~UniValue(&local_d8);
      }
      bVar6 = bVar6 | 0x10;
      break;
    default:
switchD_004fc047_default:
      unaff_RBP = 0;
      goto LAB_004fc4d1;
    }
    raw = local_38 + local_100;
    jVar5 = jVar3;
  } while (local_118 != iStack_110._M_current);
  jVar5 = getJsonToken(&local_78,&local_f4,raw,local_80);
  unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),jVar5 == JTOK_NONE);
LAB_004fc4d1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_118 != (UniValue **)0x0) {
    operator_delete(local_118);
  }
  return unaff_RBP & 0xffffffff;
}

Assistant:

bool UniValue::read(const char *raw, size_t size)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* end = raw + size;
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}